

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

void mcu8str_ensure_dynamic_buffer(mcu8str *str)

{
  mcu8str str2;
  mcu8str local_28;
  
  if (str->owns_memory != 0) {
    return;
  }
  mcu8str_copy(&local_28,str);
  str->c_str = local_28.c_str;
  str->size = local_28.size;
  str->buflen = local_28.buflen;
  str->owns_memory = local_28.owns_memory;
  return;
}

Assistant:

void mcu8str_ensure_dynamic_buffer( mcu8str* str )
  {
    if ( str->owns_memory )
      return;
    mcu8str str2 = mcu8str_copy( str );
    mcu8str_swap( &str2, str );
    assert( !str2.owns_memory );
    assert( str->owns_memory );
    //No need to call mcu8str_dealloc( &str2 ) since it does not own the memory
    //now.
  }